

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O1

void __thiscall
dgMeshEffect::BuildFromVertexListIndexList
          (dgMeshEffect *this,HaI32 faceCount,HaI32 *faceIndexCount,HaI32 *faceMaterialIndex,
          HaF32 *vertex,HaI32 vertexStrideInBytes,HaI32 *vertexIndex,HaF32 *normal,
          HaI32 normalStrideInBytes,HaI32 *normalIndex,HaF32 *uv0,HaI32 uv0StrideInBytes,
          HaI32 *uv0Index,HaF32 *uv1,HaI32 uv1StrideInBytes,HaI32 *uv1Index)

{
  dgBigVector *pdVar1;
  int count;
  dgTreeNode *this_00;
  HaI32 HVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  int *piVar8;
  dgEdge *pdVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  HaI32 *pHVar16;
  bool bVar17;
  long lVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  float *pfVar22;
  double dVar23;
  dgStack<signed_char> faceMark;
  dgStack<int> attrIndexMap;
  dgVertexAtribute point;
  HaI32 index [256];
  int local_cdc;
  dgStack<signed_char> local_c90;
  long local_c80;
  ulong local_c78;
  dgStack<int> local_c70;
  ulong local_c60;
  HaI32 *local_c58;
  long local_c50;
  HaI32 *local_c48;
  HaI32 *local_c40;
  dgVertexAtribute local_c38 [21];
  HaI32 local_438 [258];
  
  uVar20 = 0;
  *(undefined4 *)&(this->super_dgRefCounter).field_0xc = 0;
  this->m_atribCount = 0;
  this_00 = (this->super_dgPolyhedra).super_dgTree<dgEdge,_long>.m_head;
  local_c58 = faceMaterialIndex;
  if (this_00 != (dgTreeNode *)0x0) {
    (this->super_dgPolyhedra).super_dgTree<dgEdge,_long>.m_count = 0;
    dgRedBackNode::RemoveAll(&this_00->super_dgRedBackNode);
    (this->super_dgPolyhedra).super_dgTree<dgEdge,_long>.m_head = (dgTreeNode *)0x0;
  }
  uVar11 = (ulong)(uint)faceCount;
  if (0 < faceCount) {
    uVar4 = 0;
    iVar12 = 0;
    uVar20 = 0;
    do {
      iVar10 = faceIndexCount[uVar4];
      if (0 < (long)iVar10) {
        lVar18 = 0;
        uVar15 = uVar20;
        do {
          uVar20 = vertexIndex[iVar12 + lVar18] + 1U;
          if ((int)(vertexIndex[iVar12 + lVar18] + 1U) <= (int)uVar15) {
            uVar20 = uVar15;
          }
          lVar18 = lVar18 + 1;
          uVar15 = uVar20;
        } while (iVar10 != lVar18);
      }
      iVar12 = iVar10 + iVar12;
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar11);
  }
  lVar18 = (long)(vertexStrideInBytes >> 2);
  uVar4 = (ulong)uVar20;
  local_c80 = lVar18;
  if ((int)uVar20 < 1) {
    iVar12 = 0;
  }
  else {
    pfVar22 = (float *)(vertex + 3);
    iVar12 = 0;
    uVar21 = uVar4;
    do {
      local_c38[0].m_vertex.super_dgTemplateVector<double>.m_x = (double)pfVar22[-3];
      local_c38[0].m_vertex.super_dgTemplateVector<double>.m_y = (double)pfVar22[-2];
      local_c38[0].m_vertex.super_dgTemplateVector<double>.m_z = (double)pfVar22[-1];
      local_c38[0].m_vertex.super_dgTemplateVector<double>.m_w = (double)*pfVar22;
      if ((((NAN(*pfVar22)) ||
           (0x7fefffffffffffff < (long)ABS(local_c38[0].m_vertex.super_dgTemplateVector<double>.m_w)
           )) || (NAN(pfVar22[-1]))) ||
         (((0x7fefffffffffffff < (long)ABS(local_c38[0].m_vertex.super_dgTemplateVector<double>.m_z)
           || (NAN(pfVar22[-2]))) ||
          ((0x7fefffffffffffff < (long)ABS(local_c38[0].m_vertex.super_dgTemplateVector<double>.m_x)
           || (0x7fefffffffffffff <
               (long)ABS(local_c38[0].m_vertex.super_dgTemplateVector<double>.m_y))))))) {
LAB_0088a778:
        __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                      ,0x159,
                      "dgBigVector::dgBigVector(hacd::HaF64, hacd::HaF64, hacd::HaF64, hacd::HaF64)"
                     );
      }
      AddVertex(this,&local_c38[0].m_vertex);
      iVar12 = (uint)((float)iVar12 < *pfVar22) + iVar12;
      pfVar22 = pfVar22 + lVar18;
      uVar21 = uVar21 - 1;
    } while (uVar21 != 0);
  }
  local_c60 = uVar4;
  if (0 < faceCount) {
    uVar4 = 0;
    lVar18 = (long)(uv1StrideInBytes >> 2);
    local_cdc = 0;
    local_c50 = lVar18;
    do {
      iVar10 = faceIndexCount[uVar4];
      local_c78 = uVar4;
      if (0 < (long)iVar10) {
        lVar5 = (long)local_cdc;
        iVar13 = local_c58[uVar4];
        local_c40 = uv0Index + lVar5;
        local_c48 = uv1Index + lVar5;
        lVar14 = 0;
        do {
          pdVar1 = this->m_points + vertexIndex[lVar5 + lVar14];
          local_c38[0].m_vertex.super_dgTemplateVector<double>.m_x =
               (pdVar1->super_dgTemplateVector<double>).m_x;
          local_c38[0].m_vertex.super_dgTemplateVector<double>.m_y =
               (pdVar1->super_dgTemplateVector<double>).m_y;
          local_c38[0].m_vertex.super_dgTemplateVector<double>.m_z =
               (pdVar1->super_dgTemplateVector<double>).m_z;
          local_c38[0].m_vertex.super_dgTemplateVector<double>.m_w =
               (pdVar1->super_dgTemplateVector<double>).m_w;
          lVar6 = (long)normalIndex[lVar5 + lVar14] * (long)(normalStrideInBytes >> 2);
          local_c38[0].m_normal_x = (HaF64)(double)(float)normal[lVar6];
          local_c38[0].m_normal_y = (HaF64)(double)(float)normal[lVar6 + 1];
          local_c38[0].m_normal_z = (HaF64)(double)(float)normal[lVar6 + 2];
          lVar6 = (long)local_c40[lVar14] * (long)(uv0StrideInBytes >> 2);
          local_c38[0].m_u0 = (HaF64)(double)(float)uv0[lVar6];
          local_c38[0].m_v0 = (HaF64)(double)(float)uv0[lVar6 + 1];
          local_c38[0].m_u1 = (HaF64)(double)(float)uv1[local_c48[lVar14] * lVar18];
          local_c38[0].m_v1 = (HaF64)(double)(float)uv1[local_c48[lVar14] * lVar18 + 1];
          local_c38[0].m_material = (HaF64)(double)iVar13;
          AddAtribute(this,local_c38);
          lVar14 = lVar14 + 1;
          lVar18 = local_c50;
        } while (iVar10 != lVar14);
      }
      local_cdc = iVar10 + local_cdc;
      uVar4 = local_c78 + 1;
    } while (uVar4 != uVar11);
  }
  iVar10 = this->m_atribCount;
  local_c70.super_dgStackBase.m_ptr = malloc((long)(iVar10 * 4));
  local_c70.m_size = iVar10;
  if (iVar10 < 0) {
    pcVar7 = "T &dgStack<int>::operator[](hacd::HaI32) [T = int]";
  }
  else {
    HVar2 = dgVertexListToIndexList
                      ((HaF64 *)this->m_attib,0x60,0xc,iVar10,
                       (HaI32 *)local_c70.super_dgStackBase.m_ptr,0.0);
    this->m_atribCount = HVar2;
    local_c90.super_dgStackBase.m_ptr = malloc((long)faceCount);
    local_c90.m_size = faceCount;
    if (-1 < faceCount) {
      memset(local_c90.super_dgStackBase.m_ptr,1,(long)faceCount);
      local_c80 = local_c80 << 2;
      iVar10 = 0;
      do {
        iVar19 = 0;
        iVar13 = iVar19;
        if (faceCount != 0) {
          uVar4 = 0;
          iVar3 = 0;
          do {
            count = faceIndexCount[uVar4];
            lVar18 = (long)count;
            if (0xff < lVar18) {
              __assert_fail("indexCount < hacd::HaI32 (sizeof (index) / sizeof (index[0]))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgMeshEffect.cpp"
                            ,0x4ed,
                            "void dgMeshEffect::BuildFromVertexListIndexList(hacd::HaI32, const hacd::HaI32 *const, const hacd::HaI32 *const, const hacd::HaF32 *const, hacd::HaI32, const hacd::HaI32 *const, const hacd::HaF32 *const, hacd::HaI32, const hacd::HaI32 *const, const hacd::HaF32 *const, hacd::HaI32, const hacd::HaI32 *const, const hacd::HaF32 *const, hacd::HaI32, const hacd::HaI32 *const)"
                           );
            }
            pcVar7 = dgStack<signed_char>::operator[](&local_c90,(HaI32)uVar4);
            iVar13 = iVar3;
            if (*pcVar7 != '\0') {
              if (0 < count) {
                lVar5 = 0;
                do {
                  local_438[lVar5] = vertexIndex[iVar19 + lVar5] + iVar10 * uVar20;
                  piVar8 = dgStack<int>::operator[](&local_c70,iVar19 + (int)lVar5);
                  (&local_c38[0].m_vertex.super_dgTemplateVector<double>.m_x)[lVar5] =
                       (double)(long)*piVar8;
                  lVar5 = lVar5 + 1;
                } while (lVar18 != lVar5);
              }
              pdVar9 = dgPolyhedra::AddFace
                                 (&this->super_dgPolyhedra,count,local_438,(HaI64 *)local_c38);
              if (pdVar9 == (dgEdge *)0x0) {
                iVar13 = 1;
                if (1 < count) {
                  uVar21 = 0;
                  pHVar16 = local_438;
                  bVar17 = false;
                  do {
                    piVar8 = local_438 + uVar21;
                    uVar21 = uVar21 + 1;
                    lVar5 = 1;
                    do {
                      if (*piVar8 == pHVar16[lVar5]) {
                        bVar17 = true;
                      }
                      lVar5 = lVar5 + 1;
                    } while (lVar18 != lVar5);
                    pHVar16 = pHVar16 + 1;
                    lVar18 = lVar18 + -1;
                  } while (uVar21 != count - 1);
                  if (bVar17) goto LAB_0088a56a;
                }
              }
              else {
LAB_0088a56a:
                pcVar7 = dgStack<signed_char>::operator[](&local_c90,(HaI32)uVar4);
                *pcVar7 = '\0';
                iVar13 = iVar3;
              }
            }
            iVar19 = count + iVar19;
            uVar4 = uVar4 + 1;
            iVar3 = iVar13;
          } while (uVar4 != uVar11);
        }
        lVar18 = local_c80;
        if ((iVar13 != 0) && (iVar10 = iVar10 + 1, 0 < (int)uVar20)) {
          dVar23 = (double)(iVar12 + iVar10);
          uVar4 = local_c60;
          pfVar22 = (float *)(vertex + 2);
          do {
            local_c38[0].m_vertex.super_dgTemplateVector<double>.m_x = (double)pfVar22[-2];
            local_c38[0].m_vertex.super_dgTemplateVector<double>.m_y = (double)pfVar22[-1];
            local_c38[0].m_vertex.super_dgTemplateVector<double>.m_z = (double)*pfVar22;
            local_c38[0].m_vertex.super_dgTemplateVector<double>.m_w = dVar23;
            if ((((NAN(*pfVar22)) ||
                 (0x7fefffffffffffff <
                  (long)ABS(local_c38[0].m_vertex.super_dgTemplateVector<double>.m_z))) ||
                (NAN(pfVar22[-1]))) ||
               ((0x7fefffffffffffff <
                 (long)ABS(local_c38[0].m_vertex.super_dgTemplateVector<double>.m_x) ||
                (0x7fefffffffffffff <
                 (long)ABS(local_c38[0].m_vertex.super_dgTemplateVector<double>.m_y)))))
            goto LAB_0088a778;
            AddVertex(this,&local_c38[0].m_vertex);
            pfVar22 = (float *)((long)pfVar22 + lVar18);
            uVar4 = uVar4 - 1;
          } while (uVar4 != 0);
        }
        if (iVar13 == 0) {
          dgPolyhedra::EndFace(&this->super_dgPolyhedra);
          PackVertexArrays(this);
          free(local_c90.super_dgStackBase.m_ptr);
          free(local_c70.super_dgStackBase.m_ptr);
          return;
        }
      } while( true );
    }
    pcVar7 = "T &dgStack<signed char>::operator[](hacd::HaI32) [T = signed char]";
  }
  __assert_fail("(entry < m_size) || ((m_size == 0) && (entry == 0))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgStack.h"
                ,0x60,pcVar7);
}

Assistant:

void dgMeshEffect::BuildFromVertexListIndexList(
	hacd::HaI32 faceCount, const hacd::HaI32* const faceIndexCount, const hacd::HaI32* const faceMaterialIndex, 
	const hacd::HaF32* const vertex, hacd::HaI32 vertexStrideInBytes, const hacd::HaI32* const vertexIndex,
	const hacd::HaF32* const normal, hacd::HaI32  normalStrideInBytes, const hacd::HaI32* const normalIndex,
	const hacd::HaF32* const uv0, hacd::HaI32  uv0StrideInBytes, const hacd::HaI32* const uv0Index,
	const hacd::HaF32* const uv1, hacd::HaI32  uv1StrideInBytes, const hacd::HaI32* const uv1Index)
{
	BeginPolygon ();

	// calculate vertex Count
	hacd::HaI32 acc = 0;
	hacd::HaI32 vertexCount = 0;
	for (hacd::HaI32 j = 0; j < faceCount; j ++) {
		int count = faceIndexCount[j];
		for (int i = 0; i < count; i ++) {
			vertexCount = GetMax(vertexCount, vertexIndex[acc + i] + 1);
		}
		acc += count;
	}
		
	hacd::HaI32 layerCountBase = 0;
	hacd::HaI32 vertexStride = hacd::HaI32 (vertexStrideInBytes / sizeof (hacd::HaF32));
	for (int i = 0; i < vertexCount; i ++) {
		int index = i * vertexStride;
		AddVertex (dgBigVector (vertex[index + 0], vertex[index + 1], vertex[index + 2], vertex[index + 3]));
		layerCountBase += (vertex[index + 3]) > hacd::HaF32(layerCountBase);
	}


	acc = 0;
	hacd::HaI32 normalStride = hacd::HaI32 (normalStrideInBytes / sizeof (hacd::HaF32));
	hacd::HaI32 uv0Stride = hacd::HaI32 (uv0StrideInBytes / sizeof (hacd::HaF32));
	hacd::HaI32 uv1Stride = hacd::HaI32 (uv1StrideInBytes / sizeof (hacd::HaF32));
	for (hacd::HaI32 j = 0; j < faceCount; j ++) {
		hacd::HaI32 indexCount = faceIndexCount[j];
		hacd::HaI32 materialIndex = faceMaterialIndex[j];
		for (hacd::HaI32 i = 0; i < indexCount; i ++) {
			dgVertexAtribute point;
			hacd::HaI32 index = vertexIndex[acc + i];
			point.m_vertex = m_points[index];
			
			index = normalIndex[(acc + i)] * normalStride;
			point.m_normal_x =  normal[index + 0];
			point.m_normal_y =  normal[index + 1];
			point.m_normal_z =  normal[index + 2];

			index = uv0Index[(acc + i)] * uv0Stride;
			point.m_u0 = uv0[index + 0];
			point.m_v0 = uv0[index + 1];
			
			index = uv1Index[(acc + i)] * uv1Stride;
			point.m_u1 = uv1[index + 0];
			point.m_v1 = uv1[index + 1];

			point.m_material = materialIndex;
			AddAtribute(point);
		}
		acc += indexCount;
	}


	dgStack<hacd::HaI32>attrIndexMap(m_atribCount);
	m_atribCount = dgVertexListToIndexList (&m_attib[0].m_vertex.m_x, sizeof (dgVertexAtribute), sizeof (dgVertexAtribute) / sizeof (hacd::HaF64), m_atribCount, &attrIndexMap[0], DG_VERTEXLIST_INDEXLIST_TOL);

	bool hasFaces = true;
	dgStack<hacd::HaI8> faceMark (faceCount);
	memset (&faceMark[0], 1, size_t (faceMark.GetSizeInBytes()));
	
	hacd::HaI32 layerCount = 0;
	while (hasFaces) {
		acc = 0;
		hasFaces = false;
		hacd::HaI32 vertexBank = layerCount * vertexCount;
		for (hacd::HaI32 j = 0; j < faceCount; j ++) {
			hacd::HaI32 index[256];
			hacd::HaI64 userdata[256];

			int indexCount = faceIndexCount[j];
			HACD_ASSERT (indexCount < hacd::HaI32 (sizeof (index) / sizeof (index[0])));

			if (faceMark[j]) {
				for (int i = 0; i < indexCount; i ++) {
					index[i] = vertexIndex[acc + i] + vertexBank;
					userdata[i] = attrIndexMap[acc + i];
				}
				dgEdge* const edge = AddFace (indexCount, index, userdata);
				if (edge) {
					faceMark[j] = 0;
				} else {
					// check if the face is not degenerated
					bool degeneratedFace = false;
					for (int i = 0; i < indexCount - 1; i ++) {
						for (int k = i + 1; k < indexCount; k ++) {
							if (index[i] == index[k]) {
								degeneratedFace = true;		
							}
						}
					}
					if (degeneratedFace) {
						faceMark[j] = 0;
					} else {
						hasFaces = true;
					}
				}
			}
			acc += indexCount;
		}
		if (hasFaces) {
			layerCount ++;
			for (int i = 0; i < vertexCount; i ++) {
				int index = i * vertexStride;
				AddVertex (dgBigVector (vertex[index + 0], vertex[index + 1], vertex[index + 2], hacd::HaF64 (layerCount + layerCountBase)));
			}
		}
	}

	EndFace();
	PackVertexArrays ();
//	RepairTJoints (true);
}